

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.cpp
# Opt level: O0

bool CDataFileReader::CheckSha256(IOHANDLE Handle,void *pSha256)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  uint uVar6;
  int iVar7;
  undefined1 *puVar8;
  long in_FS_OFFSET;
  uint Bytes;
  void *pSha256_local;
  IOHANDLE Handle_local;
  SHA256_DIGEST Sha256;
  uchar aBuffer [65536];
  SHA256_CTX Sha256Ctx;
  
  puVar5 = (undefined1 *)register0x00000020;
  do {
    puVar8 = puVar5;
    *(undefined8 *)(puVar8 + -0x1000) = 0;
    puVar5 = puVar8 + -0x1000;
  } while (puVar8 + -0x1000 != aBuffer + 0x78);
  *(undefined8 *)(puVar8 + 0xeff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  *(IOHANDLE *)(puVar8 + -0x10e0) = Handle;
  *(void **)(puVar8 + -0x10e8) = pSha256;
  *(undefined8 *)(puVar8 + -0x1140) = 0x236b61;
  sha256_init(*(SHA256_CTX **)(puVar8 + -0x1140));
  while( true ) {
    *(undefined8 *)(puVar8 + -0x1140) = 0x236b78;
    uVar6 = io_read(*(IOHANDLE *)(puVar8 + -0x1130),*(void **)(puVar8 + -0x1138),
                    *(uint *)(puVar8 + -0x113c));
    *(uint *)(puVar8 + -0x10ec) = uVar6;
    if (*(int *)(puVar8 + -0x10ec) == 0) break;
    *(undefined8 *)(puVar8 + -0x1140) = 0x236ba0;
    sha256_update(*(SHA256_CTX **)(puVar8 + -0x1130),*(void **)(puVar8 + -0x1138),
                  *(size_t *)(puVar8 + -0x1140));
  }
  *(undefined8 *)(puVar8 + -0x1140) = 0x236bb0;
  io_seek(*(IOHANDLE *)(puVar8 + -0x1128),*(int *)(puVar8 + -0x112c),*(int *)(puVar8 + -0x1130));
  *(undefined8 *)(puVar8 + -0x1140) = 0x236bc5;
  sha256_finish(*(SHA256_CTX **)(puVar8 + -0x1130));
  puVar1 = *(undefined8 **)(puVar8 + -0x10e8);
  uVar2 = *puVar1;
  uVar3 = puVar1[1];
  uVar4 = puVar1[3];
  *(undefined8 *)(puVar8 + -0x10a8) = puVar1[2];
  *(undefined8 *)(puVar8 + -0x10a0) = uVar4;
  *(undefined8 *)(puVar8 + -0x10b8) = uVar2;
  *(undefined8 *)(puVar8 + -0x10b0) = uVar3;
  *(undefined8 *)(puVar8 + -0x10c8) = *(undefined8 *)(puVar8 + -0x1088);
  *(undefined8 *)(puVar8 + -0x10c0) = *(undefined8 *)(puVar8 + -0x1080);
  *(undefined8 *)(puVar8 + -0x10d8) = *(undefined8 *)(puVar8 + -0x1098);
  *(undefined8 *)(puVar8 + -0x10d0) = *(undefined8 *)(puVar8 + -0x1090);
  *(undefined8 *)(puVar8 + -0x1108) = *(undefined8 *)(puVar8 + -0x10c8);
  *(undefined8 *)(puVar8 + -0x1100) = *(undefined8 *)(puVar8 + -0x10c0);
  *(undefined8 *)(puVar8 + -0x1118) = *(undefined8 *)(puVar8 + -0x10d8);
  *(undefined8 *)(puVar8 + -0x1110) = *(undefined8 *)(puVar8 + -0x10d0);
  *(undefined8 *)(puVar8 + -0x1128) = *(undefined8 *)(puVar8 + -0x10a8);
  *(undefined8 *)(puVar8 + -0x1120) = *(undefined8 *)(puVar8 + -0x10a0);
  *(undefined8 *)(puVar8 + -0x1138) = *(undefined8 *)(puVar8 + -0x10b8);
  *(undefined8 *)(puVar8 + -0x1130) = *(undefined8 *)(puVar8 + -0x10b0);
  *(undefined8 *)(puVar8 + -0x1140) = 0x236c2c;
  iVar7 = sha256_comp((SHA256_DIGEST)*(uchar (*) [32])(puVar8 + -0x1130),
                      (SHA256_DIGEST)*(uchar (*) [32])(puVar8 + -0x1110));
  puVar8[-0x10ed] = iVar7 == 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(puVar8 + 0xeff8)) {
    return (bool)(puVar8[-0x10ed] & 1);
  }
  *(undefined **)(puVar8 + -0x1140) = &UNK_00236c5e;
  __stack_chk_fail();
}

Assistant:

bool CDataFileReader::CheckSha256(IOHANDLE Handle, const void *pSha256)
{
	// read the hash of the file
	SHA256_CTX Sha256Ctx;
	sha256_init(&Sha256Ctx);
	unsigned char aBuffer[64*1024];
	
	while(1)
	{
		unsigned Bytes = io_read(Handle, aBuffer, sizeof(aBuffer));
		if(Bytes == 0)
			break;
		sha256_update(&Sha256Ctx, aBuffer, Bytes);
	}

	io_seek(Handle, 0, IOSEEK_START);
	SHA256_DIGEST Sha256 = sha256_finish(&Sha256Ctx);

	return !sha256_comp(*(const SHA256_DIGEST *)pSha256, Sha256);
}